

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

pointer __thiscall
QList<QStyleOptionViewItem::ViewItemPosition>::data
          (QList<QStyleOptionViewItem::ViewItemPosition> *this)

{
  detach(this);
  return (this->d).ptr;
}

Assistant:

pointer data() { detach(); return d->data(); }